

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_pbe_erf_gws.c
# Opt level: O0

void func_exc_pol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                 xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t542;
  double t541;
  double t538;
  double t537;
  double t536;
  double t535;
  double t532;
  double t531;
  double t530;
  double t529;
  double t528;
  double t527;
  double t526;
  double t525;
  double t524;
  double t523;
  double t521;
  double t519;
  double t518;
  double t517;
  double t516;
  double t515;
  double t513;
  double t512;
  double t511;
  double t510;
  double t509;
  double t508;
  double t507;
  double t505;
  double t502;
  double t500;
  double t496;
  double t495;
  double t493;
  double t492;
  double t491;
  double t488;
  double t483;
  double t479;
  double t478;
  double t475;
  double t470;
  double t468;
  double t467;
  double t466;
  double t465;
  double t464;
  double t463;
  double t462;
  double t461;
  double t460;
  double t459;
  double t458;
  double t457;
  double t456;
  double t454;
  double t453;
  double t450;
  double t448;
  double t445;
  double t442;
  double t441;
  double t439;
  double t437;
  double t436;
  double t431;
  double t430;
  double t429;
  double t428;
  double t427;
  double t424;
  double t423;
  double t421;
  double t420;
  double t419;
  double t418;
  double t417;
  double t416;
  double t415;
  double t414;
  double t413;
  double t412;
  double t410;
  double t409;
  double t408;
  double t407;
  double t405;
  double t401;
  double t400;
  double t398;
  double t397;
  double t394;
  double t388;
  double t387;
  double t386;
  double t383;
  double t378;
  double t374;
  double t373;
  double t370;
  double t365;
  double t363;
  double t361;
  double t360;
  double t357;
  double t355;
  double t353;
  double t351;
  double t348;
  double t347;
  double t345;
  double t343;
  double t341;
  double t340;
  double t339;
  double t338;
  double t333;
  double t332;
  double t331;
  double t330;
  double t329;
  double t328;
  double t325;
  double t324;
  double t322;
  double t321;
  double t320;
  double t319;
  double t318;
  double t317;
  double t316;
  double t315;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t306;
  double t304;
  double t303;
  double t299;
  double t298;
  double t296;
  double t295;
  double t294;
  double t291;
  double t285;
  double t284;
  double t283;
  double t280;
  double t275;
  double t271;
  double t270;
  double t267;
  double t262;
  double t260;
  double t259;
  double t255;
  double t253;
  double t251;
  double t250;
  double t247;
  double t245;
  double t243;
  double t242;
  double t241;
  double t240;
  double t239;
  double t238;
  double t237;
  double t236;
  double t234;
  double t231;
  double t230;
  double t228;
  double t226;
  double t224;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t216;
  double t215;
  double t214;
  double t212;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t202;
  double t201;
  double t199;
  double t198;
  double t196;
  double t195;
  double t194;
  double t193;
  double t192;
  double t191;
  double t187;
  double t184;
  double t181;
  double t180;
  double t178;
  double t177;
  double t175;
  double t173;
  double t172;
  double t169;
  double t168;
  double t166;
  double t163;
  double t160;
  double t157;
  double t156;
  double t154;
  double t153;
  double t151;
  double t150;
  double t147;
  double t146;
  double t145;
  double t144;
  double t143;
  double t140;
  double t139;
  double t138;
  double t137;
  double t136;
  double t134;
  double t133;
  double t132;
  double t130;
  double t127;
  double t126;
  double t125;
  double t123;
  double t122;
  double t121;
  double t120;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t110;
  double t109;
  double t105;
  double t104;
  double t102;
  double t101;
  double t99;
  double t98;
  double t97;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t88;
  double t85;
  double t82;
  double t81;
  double t79;
  double t78;
  double t76;
  double t74;
  double t73;
  double t72;
  double t69;
  double t68;
  double t66;
  double t63;
  double t60;
  double t57;
  double t56;
  double t54;
  double t53;
  double t51;
  double t50;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t32;
  double t31;
  double t30;
  double t29;
  double t28;
  double t27;
  double t26;
  double t25;
  double t24;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t17;
  double t16;
  double t15;
  double t14;
  double t13;
  double t12;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double t3;
  double local_b48;
  double local_b40;
  double local_b30;
  double local_b20;
  double local_b18;
  double local_b10;
  double local_b08;
  double local_af8;
  double local_af0;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  bool local_ac1;
  double local_ac0;
  double local_ab8;
  double local_ab0;
  double local_aa8;
  double local_aa0;
  double local_a98;
  bool local_a89;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = *in_RDX - in_RDX[1];
  __x = *in_RDX + in_RDX[1];
  dVar5 = dVar4 * (1.0 / __x);
  dVar6 = dVar5 + 1.0;
  dVar7 = (double)(dVar6 <= (double)in_RDI[0x31]);
  local_a89 = *in_RDX <= (double)in_RDI[0x30] || dVar7 != 0.0;
  dVar8 = (double)local_a89;
  dVar9 = cbrt(0.3183098861837907);
  dVar10 = dVar9 * 2.519842099789747 * 1.2599210498948732;
  dVar11 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_b20 = cbrt((double)in_RDI[0x31]);
  local_b48 = local_b20 * (double)in_RDI[0x31];
  local_a98 = local_b48;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_a98 = 2.5198420997897464;
  }
  dVar12 = cbrt(__x);
  dVar13 = cbrt(1.0 / dVar6);
  dVar14 = cbrt(9.0);
  dVar14 = dVar14 * dVar14 * dVar9 * dVar9 * (double)in_RDI[4] * 1.4422495703074083;
  dVar15 = (1.0 / dVar12) * 1.2599210498948732;
  local_aa0 = local_b20;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa0 = 1.2599210498948732;
  }
  local_ab0 = (dVar14 * dVar15 * dVar13 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ab0;
  dVar11 = (double)(1.35 < local_ab0);
  local_aa8 = local_ab0;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa8 = 1.35;
  }
  local_aa8 = local_aa8 * local_aa8;
  dVar16 = local_aa8 * local_aa8;
  dVar17 = dVar16 * dVar16;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_ab0 = 1.35;
  }
  dVar11 = sqrt(3.141592653589793);
  dVar18 = erf((1.0 / local_ab0) / 2.0);
  dVar19 = exp(-(1.0 / (local_ab0 * local_ab0)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ab8 = (((((((1.0 / local_aa8) / 36.0 - (1.0 / dVar16) / 960.0) +
                    (1.0 / (dVar16 * local_aa8)) / 26880.0) - (1.0 / dVar17) / 829440.0) +
                  ((1.0 / dVar17) / local_aa8) / 28385280.0) -
                 ((1.0 / dVar17) / dVar16) / 1073479680.0) +
                ((1.0 / dVar17) / (dVar16 * local_aa8)) / 44590694400.0) -
                (1.0 / (dVar17 * dVar17)) / 2021444812800.0;
  }
  else {
    local_ab8 = -(local_ab0 * 2.6666666666666665) *
                (local_ab0 * 2.0 *
                 (-(local_ab0 * local_ab0 * 2.0) * (dVar19 - 1.0) + (dVar19 - 1.5)) +
                dVar11 * dVar18) + 1.0;
  }
  dVar16 = *pdVar1;
  dVar17 = pdVar1[1];
  dVar18 = *in_RCX;
  dVar20 = *in_RDX * *in_RDX;
  dVar21 = cbrt(*in_RDX);
  dVar22 = (1.0 / (dVar21 * dVar21)) / dVar20;
  dVar23 = *in_RCX * dVar22;
  dVar19 = pdVar1[2];
  dVar24 = cbrt(9.869604401089358);
  dVar24 = dVar24 * dVar24 * 3.3019272488946267;
  dVar25 = dVar24 * 0.3;
  dVar21 = *in_R9 * ((1.0 / (dVar21 * dVar21)) / *in_RDX);
  dVar26 = dVar25 - dVar21;
  dVar27 = dVar25 + dVar21;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_ac0 = 0.0;
  }
  else {
    local_ac0 = dVar6 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar13) * local_ab8 *
                (dVar19 * dVar26 * (1.0 / dVar27) +
                dVar17 * dVar18 * 0.003840616724010807 * dVar22 *
                (1.0 / (dVar23 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  dVar5 = 1.0 - dVar5;
  dVar13 = (double)(dVar5 <= (double)in_RDI[0x31]);
  local_ac1 = in_RDX[1] <= (double)in_RDI[0x30] || dVar13 != 0.0;
  dVar18 = (double)local_ac1;
  dVar28 = cbrt(1.0 / dVar5);
  local_ad8 = (dVar14 * dVar15 * dVar28 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ad8;
  dVar14 = (double)(1.35 < local_ad8);
  local_ad0 = local_ad8;
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    local_ad0 = 1.35;
  }
  local_ad0 = local_ad0 * local_ad0;
  dVar29 = local_ad0 * local_ad0;
  dVar30 = dVar29 * dVar29;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_ad8 = 1.35;
  }
  dVar14 = erf((1.0 / local_ad8) / 2.0);
  dVar31 = exp(-(1.0 / (local_ad8 * local_ad8)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ae0 = (((((((1.0 / local_ad0) / 36.0 - (1.0 / dVar29) / 960.0) +
                    (1.0 / (dVar29 * local_ad0)) / 26880.0) - (1.0 / dVar30) / 829440.0) +
                  ((1.0 / dVar30) / local_ad0) / 28385280.0) -
                 ((1.0 / dVar30) / dVar29) / 1073479680.0) +
                ((1.0 / dVar30) / (dVar29 * local_ad0)) / 44590694400.0) -
                (1.0 / (dVar30 * dVar30)) / 2021444812800.0;
  }
  else {
    local_ae0 = -(local_ad8 * 2.6666666666666665) *
                (local_ad8 * 2.0 *
                 (-(local_ad8 * local_ad8 * 2.0) * (dVar31 - 1.0) + (dVar31 - 1.5)) +
                dVar11 * dVar14) + 1.0;
  }
  dVar11 = in_RCX[2];
  dVar14 = in_RDX[1] * in_RDX[1];
  dVar29 = cbrt(in_RDX[1]);
  dVar30 = (1.0 / (dVar29 * dVar29)) / dVar14;
  dVar31 = in_RCX[2] * dVar30;
  dVar32 = in_R9[1] * ((1.0 / (dVar29 * dVar29)) / in_RDX[1]);
  dVar29 = dVar25 - dVar32;
  dVar25 = dVar25 + dVar32;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_ae8 = 0.0;
  }
  else {
    local_ae8 = dVar5 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar28) * local_ae0 *
                (dVar19 * dVar29 * (1.0 / dVar25) +
                dVar17 * dVar11 * 0.003840616724010807 * dVar30 *
                (1.0 / (dVar31 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  if ((dVar7 != 0.0) || (local_af0 = dVar6, NAN(dVar7))) {
    local_af0 = (double)in_RDI[0x31];
  }
  dVar10 = dVar9 * 1.4422495703074083 * 2.519842099789747;
  local_b20 = 1.0 / local_b20;
  dVar11 = cbrt(dVar6);
  local_af8 = local_b20;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_af8 = 1.0 / dVar11;
  }
  dVar16 = dVar10 * dVar15 * local_af8;
  dVar17 = sqrt(dVar16);
  dVar19 = sqrt(dVar16);
  dVar19 = dVar16 * dVar19;
  dVar28 = dVar9 * dVar9 * 2.080083823051904;
  dVar33 = dVar28 * 1.5874010519681996;
  dVar34 = 1.0 / (dVar12 * dVar12);
  dVar35 = dVar34 * 1.5874010519681996;
  dVar36 = dVar33 * dVar35 * local_af8 * local_af8;
  dVar37 = log(16.081979498692537 /
               (dVar36 * 0.123235 + dVar19 * 0.204775 + dVar17 * 3.79785 + dVar16 * 0.8969) + 1.0);
  dVar37 = (dVar16 * 0.053425 + 1.0) * 0.0621814 * dVar37;
  local_b08 = local_b48;
  if ((double)in_RDI[0x31] < 0.0) {
    local_b08 = 0.0;
  }
  dVar38 = ((local_a98 + local_b08) - 2.0) * 1.9236610509315362;
  dVar39 = log(32.16395899738507 /
               (dVar36 * 0.1562925 + dVar19 * 0.420775 + dVar17 * 7.05945 + dVar16 * 1.549425) + 1.0
              );
  dVar17 = log(29.608749977793437 /
               (dVar36 * 0.1241775 + dVar19 * 0.1100325 + dVar17 * 5.1785 + dVar16 * 0.905775) + 1.0
              );
  dVar17 = (dVar16 * 0.0278125 + 1.0) * dVar17;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_b10 = 0.0;
  }
  else {
    local_b10 = (local_af0 *
                (dVar38 * 0.0197516734986138 * dVar17 +
                dVar38 * (dVar17 * -0.0197516734986138 +
                         (dVar16 * 0.05137 + 1.0) * -0.0310907 * dVar39 + dVar37) + -dVar37)) / 2.0;
  }
  dVar8 = pdVar1[3];
  dVar16 = *in_RCX;
  dVar37 = dVar23 * 0.46914023462026644 + 1.0;
  dVar17 = pdVar1[4];
  dVar19 = pdVar1[5];
  dVar39 = dVar26 * dVar26;
  dVar40 = dVar27 * dVar27;
  dVar36 = pdVar1[6];
  dVar41 = *in_RCX * *in_RCX;
  dVar41 = dVar41 * dVar41 * dVar41;
  dVar20 = dVar20 * dVar20 * dVar20 * dVar20;
  dVar42 = 1.0 / (dVar20 * dVar20);
  dVar43 = dVar37 * dVar37;
  dVar43 = (1.0 / (dVar43 * dVar43)) / dVar43;
  dVar20 = pdVar1[7];
  if ((dVar13 != 0.0) || (local_b18 = dVar5, NAN(dVar13))) {
    local_b18 = (double)in_RDI[0x31];
  }
  dVar44 = cbrt(dVar5);
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b20 = 1.0 / dVar44;
  }
  dVar10 = dVar10 * dVar15 * local_b20;
  dVar15 = sqrt(dVar10);
  dVar45 = sqrt(dVar10);
  dVar45 = dVar10 * dVar45;
  dVar33 = dVar33 * dVar35 * local_b20 * local_b20;
  dVar35 = log(16.081979498692537 /
               (dVar33 * 0.123235 + dVar45 * 0.204775 + dVar15 * 3.79785 + dVar10 * 0.8969) + 1.0);
  dVar35 = (dVar10 * 0.053425 + 1.0) * 0.0621814 * dVar35;
  dVar46 = log(32.16395899738507 /
               (dVar33 * 0.1562925 + dVar45 * 0.420775 + dVar15 * 7.05945 + dVar10 * 1.549425) + 1.0
              );
  dVar15 = log(29.608749977793437 /
               (dVar33 * 0.1241775 + dVar45 * 0.1100325 + dVar15 * 5.1785 + dVar10 * 0.905775) + 1.0
              );
  dVar15 = (dVar10 * 0.0278125 + 1.0) * dVar15;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_b30 = 0.0;
  }
  else {
    local_b30 = (local_b18 *
                (dVar38 * 0.0197516734986138 * dVar15 +
                dVar38 * (dVar15 * -0.0197516734986138 +
                         (dVar10 * 0.05137 + 1.0) * -0.0310907 * dVar46 + dVar35) + -dVar35)) / 2.0;
  }
  dVar10 = in_RCX[2];
  dVar15 = dVar31 * 0.46914023462026644 + 1.0;
  dVar18 = dVar29 * dVar29;
  dVar33 = dVar25 * dVar25;
  dVar35 = in_RCX[2] * in_RCX[2];
  dVar35 = dVar35 * dVar35 * dVar35;
  dVar14 = dVar14 * dVar14 * dVar14 * dVar14;
  dVar14 = 1.0 / (dVar14 * dVar14);
  dVar38 = dVar15 * dVar15;
  dVar38 = (1.0 / (dVar38 * dVar38)) / dVar38;
  dVar9 = dVar9 * 1.4422495703074083 * 2.519842099789747 * (1.0 / dVar12);
  dVar12 = sqrt(dVar9);
  dVar45 = sqrt(dVar9);
  dVar45 = dVar9 * dVar45;
  dVar34 = dVar28 * 1.5874010519681996 * dVar34;
  dVar28 = log(16.081979498692537 /
               (dVar34 * 0.123235 + dVar45 * 0.204775 + dVar12 * 3.79785 + dVar9 * 0.8969) + 1.0);
  dVar28 = (dVar9 * 0.053425 + 1.0) * 0.0621814 * dVar28;
  local_b40 = local_b48;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_b40 = dVar11 * dVar6;
  }
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b48 = dVar44 * dVar5;
  }
  dVar5 = ((local_b40 + local_b48) - 2.0) * 1.9236610509315362;
  dVar13 = log(32.16395899738507 /
               (dVar34 * 0.1562925 + dVar45 * 0.420775 + dVar12 * 7.05945 + dVar9 * 1.549425) + 1.0)
  ;
  dVar12 = log(29.608749977793437 /
               (dVar34 * 0.1241775 + dVar45 * 0.1100325 + dVar12 * 5.1785 + dVar9 * 0.905775) + 1.0)
  ;
  dVar12 = (dVar9 * 0.0278125 + 1.0) * dVar12;
  dVar6 = pdVar1[9];
  dVar24 = dVar24 * 0.3 * (dVar21 + dVar32);
  dVar32 = dVar21 * 2.0 * dVar32;
  dVar21 = dVar24 - dVar32;
  dVar21 = dVar21 * dVar21;
  dVar24 = dVar24 + dVar32;
  dVar24 = dVar24 * dVar24;
  dVar7 = pdVar1[10];
  dVar32 = dVar21 * dVar21 * dVar21;
  dVar34 = (1.0 / (dVar24 * dVar24)) / dVar24;
  dVar11 = pdVar1[0xb];
  dVar23 = sqrt(dVar23 + dVar31);
  dVar23 = cbrt(dVar23 * 1.4142135623730951);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_ac0 + local_ae8 +
         local_b10 *
         (dVar20 * dVar39 * dVar39 * (1.0 / (dVar40 * dVar40)) * 0.010661445329398458 * dVar41 *
          dVar42 * dVar43 +
         dVar36 * dVar41 * 0.010661445329398458 * dVar42 * dVar43 +
         dVar19 * dVar39 * (1.0 / dVar40) +
         dVar8 * dVar16 * 0.46914023462026644 * dVar22 * (1.0 / dVar37) +
         dVar17 * dVar26 * (1.0 / dVar27)) +
         local_b30 *
         (dVar20 * dVar18 * dVar18 * (1.0 / (dVar33 * dVar33)) * 0.010661445329398458 * dVar35 *
          dVar14 * dVar38 +
         dVar36 * dVar35 * 0.010661445329398458 * dVar14 * dVar38 +
         dVar19 * dVar18 * (1.0 / dVar33) +
         dVar8 * dVar10 * 0.46914023462026644 * dVar30 * (1.0 / dVar15) +
         dVar17 * dVar29 * (1.0 / dVar25)) +
         (((dVar5 * 0.0197516734986138 * dVar12 +
           dVar4 * dVar4 * dVar4 * dVar4 * (1.0 / (__x * __x * __x * __x)) *
           dVar5 * (dVar12 * -0.0197516734986138 +
                   (dVar9 * 0.05137 + 1.0) * -0.0310907 * dVar13 + dVar28) + -dVar28) - local_b10) -
         local_b30) *
         (dVar7 * dVar32 * dVar34 + dVar6 * dVar21 * (1.0 / dVar24) + pdVar1[8] +
          (dVar11 * dVar32 * dVar34 * 1.2599210498948732 * dVar23 * dVar23) / 2.0 +
         (pdVar1[0xc] * dVar21 * (1.0 / dVar24) * 1.2599210498948732 * dVar23 * dVar23) / 2.0) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_pol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t1, t2, t3, t4, t5, t6, t7, t8;
  double t9, t10, t11, t13, t14, t17, t19, t20;
  double t21, t22, t23, t24, t25, t27, t30, t31;
  double t33, t34, t35, t36, t37, t38, t39, t40;
  double t41, t42, t43, t44, t45, t46, t47, t48;
  double t49, t50, t51, t52, t53, t54, t55, t56;
  double t59, t60, t62, t67, t70, t71, t75, t80;
  double t83, t84, t85, t87, t88, t89, t91, t92;
  double t93, t95, t96, t97, t98, t99, t100, t101;
  double t102, t103, t105, t107, t108, t116, t117, t118;
  double t119, t120, t125, t126, t127, t128, t131, t132;
  double t133, t137, t138, t140, t141, t142, t143, t145;
  double t147, t148, t152, t153, t155, t156, t159, t161;
  double t162, t163, t164, t168, t169, t171, t172, t173;
  double t174, t175, t176, t177, t179, t181, t182, t183;
  double t184, t185, t186, t187, t188, t190, t191, t192;
  double t196, t197, t198, t199, t201, t202, t203, t204;
  double t205, t207, t209, t210, t211, t212, t213, t218;
  double t219, t220, t221, t223, t225, t226, t229, t230;
  double t231, t234, t242, t245, t247, t248, t251, t252;
  double t253, t254, t256, t259, t260, t261, t262, t265;
  double t266, t267, t270, t274, t279, t281, t283, t285;
  double t286, t289, t296, t299, t301, t305, t309, t310;
  double t311, t312, t313, t314, t315, t316, t318, t319;
  double t320, t321, t322, t323, t325, t326, t328, t329;
  double t331, t332, t333, t334, t335, t336, t337, t338;
  double t339, t340, t343, t344, t345, t346, t347, t348;
  double t351, t352, t353, t354, t355, t356, t357, t358;
  double t359, t360, t361, t362, t364, t366, t367, t368;
  double t369, t370, t371, t372, t375, t376, t377, t378;
  double t381, t382, t383, tzk0;

  gga_c_pbe_erf_gws_params *params;

  assert(p->params != NULL);
  params = (gga_c_pbe_erf_gws_params * )(p->params);

  t1 = M_CBRT3;
  t2 = 0.1e1 / M_PI;
  t3 = POW_1_3(t2);
  t4 = t1 * t3;
  t5 = M_CBRT4;
  t6 = t5 * t5;
  t7 = rho[0] + rho[1];
  t8 = POW_1_3(t7);
  t9 = 0.1e1 / t8;
  t10 = t6 * t9;
  t11 = t4 * t10;
  t13 = 0.1e1 + 0.53425e-1 * t11;
  t14 = sqrt(t11);
  t17 = POW_3_2(t11);
  t19 = t1 * t1;
  t20 = t3 * t3;
  t21 = t19 * t20;
  t22 = t8 * t8;
  t23 = 0.1e1 / t22;
  t24 = t5 * t23;
  t25 = t21 * t24;
  t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
  t30 = 0.1e1 + 0.16081824322151104822e2 / t27;
  t31 = log(t30);
  t33 = 0.62182e-1 * t13 * t31;
  t34 = rho[0] - rho[1];
  t35 = t34 * t34;
  t36 = t35 * t35;
  t37 = t7 * t7;
  t38 = t37 * t37;
  t39 = 0.1e1 / t38;
  t40 = t36 * t39;
  t41 = 0.1e1 / t7;
  t42 = t34 * t41;
  t43 = 0.1e1 + t42;
  t44 = t43 <= p->zeta_threshold;
  t45 = POW_1_3(p->zeta_threshold);
  t46 = t45 * p->zeta_threshold;
  t47 = POW_1_3(t43);
  t48 = t47 * t43;
  t49 = my_piecewise3(t44, t46, t48);
  t50 = 0.1e1 - t42;
  t51 = t50 <= p->zeta_threshold;
  t52 = POW_1_3(t50);
  t53 = t52 * t50;
  t54 = my_piecewise3(t51, t46, t53);
  t55 = t49 + t54 - 0.2e1;
  t56 = M_CBRT2;
  t59 = 0.1e1 / (0.2e1 * t56 - 0.2e1);
  t60 = t55 * t59;
  t62 = 0.1e1 + 0.5137e-1 * t11;
  t67 = 0.705945e1 * t14 + 0.1549425e1 * t11 + 0.420775e0 * t17 + 0.1562925e0 * t25;
  t70 = 0.1e1 + 0.32164683177870697974e2 / t67;
  t71 = log(t70);
  t75 = 0.1e1 + 0.278125e-1 * t11;
  t80 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
  t83 = 0.1e1 + 0.29608574643216675549e2 / t80;
  t84 = log(t83);
  t85 = t75 * t84;
  t87 = -0.3109e-1 * t62 * t71 + t33 - 0.19751789702565206229e-1 * t85;
  t88 = t60 * t87;
  t89 = t40 * t88;
  t91 = 0.19751789702565206229e-1 * t60 * t85;
  t92 = t47 * t47;
  t93 = t52 * t52;
  t95 = t92 / 0.2e1 + t93 / 0.2e1;
  t96 = t95 * t95;
  t97 = t96 * t95;
  t98 = log(0.2e1);
  t99 = t98 - 0.1e1;
  t100 = 0.2e1 * t99;
  t101 = t97 * t100;
  t102 = p->cam_omega * t14;
  t103 = 0.1e1 / t95;
  t105 = 0.2923025e1 * t102 * t103;
  t107 = POW_1_3(0.9e1);
  t108 = t107 * t107;
  t116 = p->cam_omega * p->cam_omega;
  t117 = (0.344851e1 - M_PI * t5 * t108 * t3 / t99 / 0.12e2) * t116;
  t118 = t117 * t1;
  t119 = t3 * t6;
  t120 = 0.1e1 / t96;
  t125 = t116 * p->cam_omega;
  t126 = t14 * t11;
  t127 = t125 * t126;
  t128 = 0.1e1 / t97;
  t131 = 0.1e1 + t105 + t118 * t119 * t9 * t120 / 0.4e1 + 0.48968e0 * t127 * t128;
  t132 = t116 * t1;
  t133 = t132 * t3;
  t137 = 0.1e1 + t105 + 0.8621275e0 * t133 * t10 * t120;
  t138 = 0.1e1 / t137;
  t140 = log(t131 * t138);
  t141 = M_PI * M_PI;
  t142 = 0.1e1 / t141;
  t143 = t140 * t142;
  t145 = 0.1e1 / t37;
  t147 = -t35 * t145 + 0.1e1;
  t148 = t41 * t147;
  t152 = t3 * t2;
  t153 = t1 * t152;
  t155 = 0.1e1 / t8 / t7;
  t156 = t6 * t155;
  t159 = 0.1e1 + 0.5175e-2 * t11 + 0.204825e-1 * t25 - 0.30486129349252551566e-2 * t41 + 0.3485625e-3 * t153 * t156;
  t161 = exp(-0.1881e0 * t11);
  t162 = t159 * t161;
  t163 = M_SQRT2;
  t164 = t162 * t163;
  t168 = t19 * t20 * t142;
  t169 = t168 * t5;
  t171 = 0.1e1 / t22 / t7;
  t172 = t43 / 0.2e1;
  t173 = t172 * t172;
  t174 = t4 * t6;
  t175 = t9 * t56;
  t176 = 0.1e1 / t43;
  t177 = POW_1_3(t176);
  t179 = t174 * t175 * t177;
  t181 = 0.1e1 - 0.56675e-2 * t179;
  t182 = t173 * t181;
  t183 = 0.1e1 / t152;
  t184 = t108 * t183;
  t185 = t182 * t184;
  t186 = t1 * t22;
  t187 = t177 * t177;
  t188 = 0.1e1 / t187;
  t190 = t21 * t5;
  t191 = t56 * t56;
  t192 = t23 * t191;
  t196 = 0.1e1 + 0.107975e0 * t179 + 0.1e-1 * t190 * t192 * t187;
  t197 = 0.1e1 / t196;
  t198 = t188 * t197;
  t199 = t186 * t198;
  t201 = 0.2e1 / 0.15e2 * t185 * t199;
  t202 = t50 / 0.2e1;
  t203 = t202 * t202;
  t204 = 0.1e1 / t50;
  t205 = POW_1_3(t204);
  t207 = t174 * t175 * t205;
  t209 = 0.1e1 - 0.56675e-2 * t207;
  t210 = t203 * t209;
  t211 = t210 * t184;
  t212 = t205 * t205;
  t213 = 0.1e1 / t212;
  t218 = 0.1e1 + 0.107975e0 * t207 + 0.1e-1 * t190 * t192 * t212;
  t219 = 0.1e1 / t218;
  t220 = t213 * t219;
  t221 = t186 * t220;
  t223 = 0.2e1 / 0.15e2 * t211 * t221;
  t225 = exp(-0.775e-1 * t11);
  t226 = t147 * t225;
  t229 = -0.12375e1 * t11 + t25 / 0.4e1;
  t230 = t229 * M_PI;
  t231 = t230 * t7;
  t234 = t201 + t223 + 0.4e1 / 0.3e1 * t226 * t231;
  t242 = t162 / 0.2e1 - 0.1e1 / 0.2e1;
  t245 = t5 * t171;
  t247 = exp(-0.13675e0 * t11);
  t248 = t147 * t247;
  t251 = -0.97e-1 * t11 + 0.169e0 * t25;
  t252 = t248 * t251;
  t253 = 0.1e1 / t20;
  t254 = t1 * t253;
  t256 = t254 * t6 * t22;
  t259 = t43 * t43;
  t260 = t92 * t259;
  t261 = t50 * t50;
  t262 = t93 * t261;
  t265 = (t260 / 0.2e1 + t262 / 0.2e1) * t108;
  t266 = t183 * t1;
  t267 = t266 * t22;
  t270 = t201 + t223 + t252 * t256 / 0.3e1 - t265 * t267 / 0.15e2;
  t274 = -t33 + t89 + t91;
  t279 = t116 * t116;
  t281 = t168 * t245;
  t283 = t161 * t163;
  t285 = t283 * t279 * p->cam_omega;
  t286 = t147 * t159 * t285;
  t289 = t171 * t147;
  t296 = t279 * t116;
  t299 = 0.1e1 / t22 / t37;
  t301 = t279 * t279;
  t305 = t101 * t143 + (-0.31505407223141117834e-1 * t148 * t164 - 0.53884053046145740922e-2 * t169 * t171 * t234 * t163) * t125 + (-0.83762820535504401876e-1 * t148 * t242 - 0.11938374665504764976e-1 * t168 * t245 * t270 + 0.42708890021612718669e0 * t153 * t156 * t274) * t279 - 0.11974234010254609094e-1 * t281 * t286 + (-0.31835665774679373271e-1 * t169 * t289 * t242 + 0.533250677421793803e-1 * t145 * t274) * t296 + 0.20267214298646782767e-1 * t169 * t299 * t274 * t301;
  t309 = 0.1e1 + 0.15403623315025e0 * t21 * t24 * t116;
  t310 = t309 * t309;
  t311 = t310 * t310;
  t312 = 0.1e1 / t311;
  t313 = t305 * t312;
  t314 = t45 * t45;
  t315 = my_piecewise3(t44, t314, t92);
  t316 = my_piecewise3(t51, t314, t93);
  t318 = t315 / 0.2e1 + t316 / 0.2e1;
  t319 = t318 * t318;
  t320 = t319 * t318;
  t321 = params->gamma * t320;
  t322 = -t33 + t89 + t91 - t313;
  t323 = 0.1e1 / t274;
  t325 = pow(t322 * t323, params->a_c);
  t326 = params->beta * t325;
  t328 = sigma[0] + 0.2e1 * sigma[1] + sigma[2];
  t329 = t326 * t328;
  t331 = 0.1e1 / t8 / t37;
  t332 = t331 * t56;
  t333 = 0.1e1 / t319;
  t334 = t332 * t333;
  t335 = t329 * t334;
  t336 = 0.1e1 / t3;
  t337 = t19 * t336;
  t338 = t337 * t5;
  t339 = 0.1e1 / params->gamma;
  t340 = 0.1e1 / t320;
  t343 = exp(-t322 * t340 * t339);
  t344 = t343 - 0.1e1;
  t345 = 0.1e1 / t344;
  t346 = t339 * t345;
  t347 = t346 * t328;
  t348 = t326 * t347;
  t351 = t348 * t334 * t338 / 0.96e2;
  t352 = 0.1e1 + t351;
  t353 = t339 * t352;
  t354 = params->beta * params->beta;
  t355 = t325 * t325;
  t356 = t354 * t355;
  t357 = params->gamma * params->gamma;
  t358 = 0.1e1 / t357;
  t359 = t344 * t344;
  t360 = 0.1e1 / t359;
  t361 = t358 * t360;
  t362 = t328 * t328;
  t364 = t356 * t361 * t362;
  t366 = 0.1e1 / t22 / t38;
  t367 = t366 * t191;
  t368 = t319 * t319;
  t369 = 0.1e1 / t368;
  t370 = t367 * t369;
  t371 = t254 * t6;
  t372 = t370 * t371;
  t375 = 0.1e1 + t351 + t364 * t372 / 0.3072e4;
  t376 = 0.1e1 / t375;
  t377 = t353 * t376;
  t378 = t338 * t377;
  t381 = 0.1e1 + t335 * t378 / 0.96e2;
  t382 = log(t381);
  t383 = t321 * t382;
  tzk0 = -t33 + t89 + t91 - t313 + t383;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}